

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_0::UnionVectorTest(string *tests_data_path)

{
  bool bVar1;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> characters_type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> characters_00;
  SizeT SVar2;
  int32_t iVar3;
  Offset<Movie> root;
  flatbuffers *pfVar4;
  size_t buffer_minalign;
  uint8_t *puVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buf;
  Movie *movie;
  MovieT *_o;
  Rapunzel *this;
  reference pvVar6;
  BookReader *pBVar7;
  AttackerT *pAVar8;
  TypeTable *pTVar9;
  Schema *this_00;
  Object *root_00;
  string *in_RCX;
  char *pcVar10;
  undefined1 local_15c8 [8];
  Parser parser2;
  bool ok;
  Schema *schema;
  char *result;
  string jsongen;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  undefined1 local_dc0 [8];
  ToStringVisitor visitor;
  string local_d38;
  undefined1 local_d18 [8];
  string s;
  Movie *repacked_movie;
  MovieT *movie_object;
  Verifier jverifier;
  uint8_t *jbuf;
  Movie *pMStack_c88;
  anon_class_1_0_00000001 TestMovie;
  Movie *flat_movie;
  Verifier verifier;
  Rapunzel local_c28;
  Offset<const_Rapunzel_*> local_c24;
  Offset<void> local_c20;
  offset_type local_c1c;
  Offset<flatbuffers::String> local_c18;
  Offset<Movie> movie_offset;
  Offset<flatbuffers::String> local_c10;
  value_type local_c0c;
  BookReader local_c08;
  Offset<const_BookReader_*> local_c04;
  value_type local_c00;
  Offset<Attacker> local_bfc;
  value_type local_bf8;
  BookReader local_bf4;
  Offset<const_BookReader_*> local_bf0;
  value_type local_bec;
  undefined1 local_be8 [8];
  vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> characters;
  undefined1 local_bc8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> types;
  FlatBufferBuilder fbb;
  Parser parser;
  IDLOptions idl_opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [8];
  string jsonfile;
  string schemafile;
  string *tests_data_path_local;
  
  std::__cxx11::string::string((string *)(jsonfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  std::operator+(&local_70,tests_data_path,"union_vector/union_vector.fbs");
  pfVar4 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(pfVar4,(char *)0x0,(bool)((char)&jsonfile + '\x18'),in_RCX);
  pcVar10 = "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp";
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"union_vector/union_vector.fbs\").c_str(), false, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0xd2,"");
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &idl_opts.grpc_python_typed_handlers,tests_data_path,
                 "union_vector/union_vector.json");
  pfVar4 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(pfVar4,(char *)0x0,SUB81(local_50,0),(string *)pcVar10);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"union_vector/union_vector.json\").c_str(), false, &jsonfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0xd6,"");
  std::__cxx11::string::~string((string *)&idl_opts.grpc_python_typed_handlers);
  IDLOptions::IDLOptions((IDLOptions *)&parser.anonymous_counter_);
  idl_opts.mini_reflect._1_1_ = idl_opts.mini_reflect._1_1_ | 1;
  Parser::Parser((Parser *)&fbb.string_pool,(IDLOptions *)&parser.anonymous_counter_);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)&fbb.string_pool,pcVar10,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser.Parse(schemafile.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0xdc,"");
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)
             &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,buffer_minalign
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8);
  characters.
  super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8,
             (value_type_conflict1 *)
             ((long)&characters.
                     super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  characters.
  super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8,
             (value_type_conflict1 *)
             ((long)&characters.
                     super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  characters.
  super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._5_1_ = 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8,
             (value_type_conflict1 *)
             ((long)&characters.
                     super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  characters.
  super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._4_1_ = 5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8,
             (value_type_conflict1 *)
             ((long)&characters.
                     super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  characters.
  super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._3_1_ = 6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8,
             (value_type_conflict1 *)
             ((long)&characters.
                     super__Vector_base<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::vector
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8);
  BookReader::BookReader(&local_bf4,7);
  local_bf0 = FlatBufferBuilderImpl<false>::CreateStruct<BookReader>
                        ((FlatBufferBuilderImpl<false> *)
                         &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_bf4);
  local_bec.o = (offset_type)Offset<const_BookReader_*>::Union(&local_bf0);
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::push_back
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8,&local_bec);
  local_bfc = CreateAttacker((FlatBufferBuilder *)
                             &types.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,5);
  local_bf8.o = (offset_type)Offset<Attacker>::Union(&local_bfc);
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::push_back
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8,&local_bf8);
  BookReader::BookReader(&local_c08,2);
  local_c04 = FlatBufferBuilderImpl<false>::CreateStruct<BookReader>
                        ((FlatBufferBuilderImpl<false> *)
                         &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_c08);
  local_c00.o = (offset_type)Offset<const_BookReader_*>::Union(&local_c04);
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::push_back
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8,&local_c00);
  local_c10 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                        ((FlatBufferBuilderImpl<false> *)
                         &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,"Other");
  local_c0c.o = (offset_type)Offset<flatbuffers::String>::Union(&local_c10);
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::push_back
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8,&local_c0c);
  local_c18 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                        ((FlatBufferBuilderImpl<false> *)
                         &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,"Unused");
  movie_offset.o = (offset_type)Offset<flatbuffers::String>::Union(&local_c18);
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::push_back
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8,(value_type *)&movie_offset);
  Rapunzel::Rapunzel(&local_c28,6);
  local_c24 = FlatBufferBuilderImpl<false>::CreateStruct<Rapunzel>
                        ((FlatBufferBuilderImpl<false> *)
                         &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_c28);
  local_c20 = Offset<const_Rapunzel_*>::Union(&local_c24);
  characters_type =
       FlatBufferBuilderImpl<false>::CreateVector<unsigned_char,std::allocator<unsigned_char>>
                 ((FlatBufferBuilderImpl<false> *)
                  &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8);
  characters_00 =
       FlatBufferBuilderImpl<false>::
       CreateVector<flatbuffers::Offset<void>,std::allocator<flatbuffers::Offset<void>>>
                 ((FlatBufferBuilderImpl<false> *)
                  &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
                  local_be8);
  verifier.flex_reuse_tracker_._4_4_ =
       CreateMovie((FlatBufferBuilder *)
                   &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,Character_Rapunzel,local_c20,
                   characters_type,characters_00);
  local_c1c = verifier.flex_reuse_tracker_._4_4_;
  FinishMovieBuffer((FlatBufferBuilder *)
                    &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,verifier.flex_reuse_tracker_._4_4_);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)
                     &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&flat_movie,puVar5,(ulong)SVar2,0x40,1000000,true);
  bVar1 = VerifyMovieBuffer((Verifier *)&flat_movie);
  TestEq<bool,bool>(bVar1,true,"\'VerifyMovieBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0xf8,"");
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pMStack_c88 = GetMovie(puVar5);
  UnionVectorTest::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&jbuf + 7),pMStack_c88);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)&fbb.string_pool,pcVar10,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser.Parse(jsonfile.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x11c,"");
  buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
        FlatBufferBuilderImpl<false>::GetBufferPointer
                  ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  jverifier.flex_reuse_tracker_ = buf;
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&movie_object,(uint8_t *)buf,(ulong)SVar2,0x40,1000000,true)
  ;
  bVar1 = VerifyMovieBuffer((Verifier *)&movie_object);
  TestEq<bool,bool>(bVar1,true,"\'VerifyMovieBuffer(jverifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x11f,"");
  movie = GetMovie(jverifier.flex_reuse_tracker_);
  UnionVectorTest::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&jbuf + 7),movie);
  _o = Movie::UnPack(pMStack_c88,(resolver_function_t *)0x0);
  this = CharacterUnion::AsRapunzel(&_o->main_character);
  iVar3 = Rapunzel::hair_length(this);
  TestEq<int,int>(iVar3,6,"\'movie_object->main_character.AsRapunzel()->hair_length()\' != \'6\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x123,"");
  pvVar6 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::operator[]
                     (&_o->characters,0);
  pBVar7 = CharacterUnion::AsBelle(pvVar6);
  iVar3 = BookReader::books_read(pBVar7);
  TestEq<int,int>(iVar3,7,"\'movie_object->characters[0].AsBelle()->books_read()\' != \'7\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x124,"");
  pvVar6 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::operator[]
                     (&_o->characters,1);
  pAVar8 = CharacterUnion::AsMuLan(pvVar6);
  TestEq<int,int>(pAVar8->sword_attack_damage,5,
                  "\'movie_object->characters[1].AsMuLan()->sword_attack_damage\' != \'5\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x125,"");
  pvVar6 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::operator[]
                     (&_o->characters,2);
  pBVar7 = CharacterUnion::AsBookFan(pvVar6);
  iVar3 = BookReader::books_read(pBVar7);
  TestEq<int,int>(iVar3,2,"\'movie_object->characters[2].AsBookFan()->books_read()\' != \'2\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x126,"");
  pvVar6 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::operator[]
                     (&_o->characters,3);
  CharacterUnion::AsOther_abi_cxx11_(pvVar6);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar10,"Other","\'movie_object->characters[3].AsOther()->c_str()\' != \'\"Other\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp",
            0x127,"");
  pvVar6 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::operator[]
                     (&_o->characters,4);
  CharacterUnion::AsUnused_abi_cxx11_(pvVar6);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar10,"Unused","\'movie_object->characters[4].AsUnused()->c_str()\' != \'\"Unused\"\'"
            ,"/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
            ,0x128,"");
  FlatBufferBuilderImpl<false>::Clear
            ((FlatBufferBuilderImpl<false> *)
             &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  root = Movie::Pack((FlatBufferBuilder *)
                     &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,_o,
                     (rehasher_function_t *)0x0);
  FlatBufferBuilderImpl<false>::Finish<Movie>
            ((FlatBufferBuilderImpl<false> *)
             &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,root,(char *)0x0);
  if (_o != (MovieT *)0x0) {
    MovieT::~MovieT(_o);
    operator_delete(_o,0x28);
  }
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  s.field_2._8_8_ = GetMovie(puVar5);
  UnionVectorTest::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&jbuf + 7),(Movie *)s.field_2._8_8_);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar9 = MovieTypeTable();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"",(allocator<char> *)&visitor.field_0x7f);
  FlatBufferToString((string *)local_d18,puVar5,pTVar9,false,true,&local_d38,false);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&visitor.field_0x7f);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar10,
            "{ main_character_type: Rapunzel, main_character: { hair_length: 6 }, characters_type: [ Belle, MuLan, BookFan, Other, Unused ], characters: [ { books_read: 7 }, { sword_attack_damage: 5 }, { books_read: 2 }, \"Other\", \"Unused\" ] }"
            ,
            "\'s.c_str()\' != \'\"{ main_character_type: Rapunzel, main_character: { hair_length: 6 }, \" \"characters_type: [ Belle, MuLan, BookFan, Other, Unused ], \" \"characters: [ { books_read: 7 }, { sword_attack_damage: 5 }, \" \"{ books_read: 2 }, \\\"Other\\\", \\\"Unused\\\" ] }\"\'"
            ,"/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
            ,0x13b,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_de0,"\n",&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e08,"  ",(allocator<char> *)(jsongen.field_2._M_local_buf + 0xf));
  ToStringVisitor::ToStringVisitor((ToStringVisitor *)local_dc0,&local_de0,true,&local_e08,true);
  std::__cxx11::string::~string((string *)&local_e08);
  std::allocator<char>::~allocator((allocator<char> *)(jsongen.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar9 = MovieTypeTable();
  IterateFlatBuffer(puVar5,pTVar9,(IterationVisitor *)local_dc0);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar10,
            "{\n  \"main_character_type\": \"Rapunzel\",\n  \"main_character\": {\n    \"hair_length\": 6\n  },\n  \"characters_type\": [\n    \"Belle\",\n    \"MuLan\",\n    \"BookFan\",\n    \"Other\",\n    \"Unused\"\n  ],\n  \"characters\": [\n    {\n      \"books_read\": 7\n    },\n    {\n      \"sword_attack_damage\": 5\n    },\n    {\n      \"books_read\": 2\n    },\n    \"Other\",\n    \"Unused\"\n  ]\n}"
            ,
            "\'visitor.s.c_str()\' != \'\"{\\n\" \"  \\\"main_character_type\\\": \\\"Rapunzel\\\",\\n\" \"  \\\"main_character\\\": {\\n\" \"    \\\"hair_length\\\": 6\\n\" \"  },\\n\" \"  \\\"characters_type\\\": [\\n\" \"    \\\"Belle\\\",\\n\" \"    \\\"MuLan\\\",\\n\" \"    \\\"BookFan\\\",\\n\" \"    \\\"Other\\\",\\n\" \"    \\\"Unused\\\"\\n\" \"  ],\\n\" \"  \\\"characters\\\": [\\n\" \"    {\\n\" \"      \\\"books_read\\\": 7\\n\" \"    },\\n\" \"    {\\n\" \"      \\\"sword_attack_damage\\\": 5\\n\" \"    },\\n\" \"    {\\n\" \"      \\\"books_read\\\": 2\\n\" \"    },\\n\" \"    \\\"Other\\\",\\n\" \"    \\\"Unused\\\"\\n\" \"  ]\\n\" \"}\"\'"
            ,"/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
            ,0x159,"");
  std::__cxx11::string::string((string *)&result);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar10 = GenText((Parser *)&fbb.string_pool,puVar5,(string *)&result);
  TestEq<bool,bool>(true,pcVar10 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x15e,"");
  pcVar10 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar10,
            "{\n  main_character_type: \"Rapunzel\",\n  main_character: {\n    hair_length: 6\n  },\n  characters_type: [\n    \"Belle\",\n    \"MuLan\",\n    \"BookFan\",\n    \"Other\",\n    \"Unused\"\n  ],\n  characters: [\n    {\n      books_read: 7\n    },\n    {\n      sword_attack_damage: 5\n    },\n    {\n      books_read: 2\n    },\n    \"Other\",\n    \"Unused\"\n  ]\n}\n"
            ,
            "\'jsongen.c_str()\' != \'\"{\\n\" \"  main_character_type: \\\"Rapunzel\\\",\\n\" \"  main_character: {\\n\" \"    hair_length: 6\\n\" \"  },\\n\" \"  characters_type: [\\n\" \"    \\\"Belle\\\",\\n\" \"    \\\"MuLan\\\",\\n\" \"    \\\"BookFan\\\",\\n\" \"    \\\"Other\\\",\\n\" \"    \\\"Unused\\\"\\n\" \"  ],\\n\" \"  characters: [\\n\" \"    {\\n\" \"      books_read: 7\\n\" \"    },\\n\" \"    {\\n\" \"      sword_attack_damage: 5\\n\" \"    },\\n\" \"    {\\n\" \"      books_read: 2\\n\" \"    },\\n\" \"    \\\"Other\\\",\\n\" \"    \\\"Unused\\\"\\n\" \"  ]\\n\" \"}\\n\"\'"
            ,"/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
            ,0x179,"");
  Parser::Serialize((Parser *)&fbb.string_pool);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  this_00 = reflection::GetSchema(puVar5);
  root_00 = reflection::Schema::root_table(this_00);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)
                      &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)
                     &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  parser2.parse_depth_counter_._3_1_ =
       flatbuffers::Verify(this_00,root_00,puVar5,(ulong)SVar2,0x40,1000000);
  TestEq<bool,bool>((bool)parser2.parse_depth_counter_._3_1_,true,"\'ok\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x180,"");
  Parser::Parser((Parser *)local_15c8,(IDLOptions *)&parser.anonymous_counter_);
  bVar1 = Parser::Parse((Parser *)local_15c8,
                        "struct Bool { b:bool; }union Any { Bool }table Root { a:Any; }root_type Root;"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser2.Parse(\"struct Bool { b:bool; }\" \"union Any { Bool }\" \"table Root { a:Any; }\" \"root_type Root;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x187,"");
  bVar1 = Parser::Parse((Parser *)local_15c8,"{a_type:Bool,a:{b:true}}",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser2.Parse(\"{a_type:Bool,a:{b:true}}\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x188,"");
  Parser::~Parser((Parser *)local_15c8);
  std::__cxx11::string::~string((string *)&result);
  ToStringVisitor::~ToStringVisitor((ToStringVisitor *)local_dc0);
  std::__cxx11::string::~string((string *)local_d18);
  std::vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_>::~vector
            ((vector<flatbuffers::Offset<void>,_std::allocator<flatbuffers::Offset<void>_>_> *)
             local_be8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_bc8);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)
             &types.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Parser::~Parser((Parser *)&fbb.string_pool);
  IDLOptions::~IDLOptions((IDLOptions *)&parser.anonymous_counter_);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(jsonfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void UnionVectorTest(const std::string &tests_data_path) {
  // load FlatBuffer fbs schema and json.
  std::string schemafile, jsonfile;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "union_vector/union_vector.fbs").c_str(),
              false, &schemafile),
          true);
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "union_vector/union_vector.json").c_str(),
              false, &jsonfile),
          true);

  // parse schema.
  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);
  TEST_EQ(parser.Parse(schemafile.c_str()), true);

  flatbuffers::FlatBufferBuilder fbb;

  // union types.
  std::vector<uint8_t> types;
  types.push_back(static_cast<uint8_t>(Character_Belle));
  types.push_back(static_cast<uint8_t>(Character_MuLan));
  types.push_back(static_cast<uint8_t>(Character_BookFan));
  types.push_back(static_cast<uint8_t>(Character_Other));
  types.push_back(static_cast<uint8_t>(Character_Unused));

  // union values.
  std::vector<flatbuffers::Offset<void>> characters;
  characters.push_back(fbb.CreateStruct(BookReader(/*books_read=*/7)).Union());
  characters.push_back(CreateAttacker(fbb, /*sword_attack_damage=*/5).Union());
  characters.push_back(fbb.CreateStruct(BookReader(/*books_read=*/2)).Union());
  characters.push_back(fbb.CreateString("Other").Union());
  characters.push_back(fbb.CreateString("Unused").Union());

  // create Movie.
  const auto movie_offset =
      CreateMovie(fbb, Character_Rapunzel,
                  fbb.CreateStruct(Rapunzel(/*hair_length=*/6)).Union(),
                  fbb.CreateVector(types), fbb.CreateVector(characters));
  FinishMovieBuffer(fbb, movie_offset);

  flatbuffers::Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize());
  TEST_EQ(VerifyMovieBuffer(verifier), true);

  auto flat_movie = GetMovie(fbb.GetBufferPointer());

  auto TestMovie = [](const Movie *movie) {
    TEST_EQ(movie->main_character_type() == Character_Rapunzel, true);

    auto cts = movie->characters_type();
    TEST_EQ(movie->characters_type()->size(), 5);
    TEST_EQ(cts->GetEnum<Character>(0) == Character_Belle, true);
    TEST_EQ(cts->GetEnum<Character>(1) == Character_MuLan, true);
    TEST_EQ(cts->GetEnum<Character>(2) == Character_BookFan, true);
    TEST_EQ(cts->GetEnum<Character>(3) == Character_Other, true);
    TEST_EQ(cts->GetEnum<Character>(4) == Character_Unused, true);

    auto rapunzel = movie->main_character_as_Rapunzel();
    TEST_NOTNULL(rapunzel);
    TEST_EQ(rapunzel->hair_length(), 6);

    auto cs = movie->characters();
    TEST_EQ(cs->size(), 5);
    auto belle = cs->GetAs<BookReader>(0);
    TEST_EQ(belle->books_read(), 7);
    auto mu_lan = cs->GetAs<Attacker>(1);
    TEST_EQ(mu_lan->sword_attack_damage(), 5);
    auto book_fan = cs->GetAs<BookReader>(2);
    TEST_EQ(book_fan->books_read(), 2);
    auto other = cs->GetAsString(3);
    TEST_EQ_STR(other->c_str(), "Other");
    auto unused = cs->GetAsString(4);
    TEST_EQ_STR(unused->c_str(), "Unused");
  };

  TestMovie(flat_movie);

  // Also test the JSON we loaded above.
  TEST_EQ(parser.Parse(jsonfile.c_str()), true);
  auto jbuf = parser.builder_.GetBufferPointer();
  flatbuffers::Verifier jverifier(jbuf, parser.builder_.GetSize());
  TEST_EQ(VerifyMovieBuffer(jverifier), true);
  TestMovie(GetMovie(jbuf));

  auto movie_object = flat_movie->UnPack();
  TEST_EQ(movie_object->main_character.AsRapunzel()->hair_length(), 6);
  TEST_EQ(movie_object->characters[0].AsBelle()->books_read(), 7);
  TEST_EQ(movie_object->characters[1].AsMuLan()->sword_attack_damage, 5);
  TEST_EQ(movie_object->characters[2].AsBookFan()->books_read(), 2);
  TEST_EQ_STR(movie_object->characters[3].AsOther()->c_str(), "Other");
  TEST_EQ_STR(movie_object->characters[4].AsUnused()->c_str(), "Unused");

  fbb.Clear();
  fbb.Finish(Movie::Pack(fbb, movie_object));

  delete movie_object;

  auto repacked_movie = GetMovie(fbb.GetBufferPointer());

  TestMovie(repacked_movie);

  // Generate text using mini-reflection.
  auto s =
      flatbuffers::FlatBufferToString(fbb.GetBufferPointer(), MovieTypeTable());
  TEST_EQ_STR(
      s.c_str(),
      "{ main_character_type: Rapunzel, main_character: { hair_length: 6 }, "
      "characters_type: [ Belle, MuLan, BookFan, Other, Unused ], "
      "characters: [ { books_read: 7 }, { sword_attack_damage: 5 }, "
      "{ books_read: 2 }, \"Other\", \"Unused\" ] }");

  flatbuffers::ToStringVisitor visitor("\n", true, "  ");
  IterateFlatBuffer(fbb.GetBufferPointer(), MovieTypeTable(), &visitor);
  TEST_EQ_STR(visitor.s.c_str(),
              "{\n"
              "  \"main_character_type\": \"Rapunzel\",\n"
              "  \"main_character\": {\n"
              "    \"hair_length\": 6\n"
              "  },\n"
              "  \"characters_type\": [\n"
              "    \"Belle\",\n"
              "    \"MuLan\",\n"
              "    \"BookFan\",\n"
              "    \"Other\",\n"
              "    \"Unused\"\n"
              "  ],\n"
              "  \"characters\": [\n"
              "    {\n"
              "      \"books_read\": 7\n"
              "    },\n"
              "    {\n"
              "      \"sword_attack_damage\": 5\n"
              "    },\n"
              "    {\n"
              "      \"books_read\": 2\n"
              "    },\n"
              "    \"Other\",\n"
              "    \"Unused\"\n"
              "  ]\n"
              "}");

  // Generate text using parsed schema.
  std::string jsongen;
  auto result = GenText(parser, fbb.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  TEST_EQ_STR(jsongen.c_str(),
              "{\n"
              "  main_character_type: \"Rapunzel\",\n"
              "  main_character: {\n"
              "    hair_length: 6\n"
              "  },\n"
              "  characters_type: [\n"
              "    \"Belle\",\n"
              "    \"MuLan\",\n"
              "    \"BookFan\",\n"
              "    \"Other\",\n"
              "    \"Unused\"\n"
              "  ],\n"
              "  characters: [\n"
              "    {\n"
              "      books_read: 7\n"
              "    },\n"
              "    {\n"
              "      sword_attack_damage: 5\n"
              "    },\n"
              "    {\n"
              "      books_read: 2\n"
              "    },\n"
              "    \"Other\",\n"
              "    \"Unused\"\n"
              "  ]\n"
              "}\n");

  // Simple test with reflection.
  parser.Serialize();
  auto schema = reflection::GetSchema(parser.builder_.GetBufferPointer());
  auto ok = flatbuffers::Verify(*schema, *schema->root_table(),
                                fbb.GetBufferPointer(), fbb.GetSize());
  TEST_EQ(ok, true);

  flatbuffers::Parser parser2(idl_opts);
  TEST_EQ(parser2.Parse("struct Bool { b:bool; }"
                        "union Any { Bool }"
                        "table Root { a:Any; }"
                        "root_type Root;"),
          true);
  TEST_EQ(parser2.Parse("{a_type:Bool,a:{b:true}}"), true);
}